

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

uint8_t __thiscall
wasm::ShellExternalInterface::load8u(ShellExternalInterface *this,Address addr,Name memoryName)

{
  bool bVar1;
  uchar uVar2;
  pointer ppVar3;
  address64_t address;
  Memory *memory;
  _Self local_30;
  iterator it;
  ShellExternalInterface *this_local;
  Name memoryName_local;
  Address addr_local;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  this_local = memoryName.super_IString.str._M_len;
  it._M_node = (_Base_ptr)this;
  memoryName_local.super_IString.str._M_str = (char *)addr.addr;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::ShellExternalInterface::Memory,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
       ::find(&this->memories,(key_type *)&this_local);
  memory = (Memory *)
           std::
           map<wasm::Name,_wasm::ShellExternalInterface::Memory,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
           ::end(&this->memories);
  bVar1 = std::operator!=(&local_30,(_Self *)&memory);
  if (!bVar1) {
    __assert_fail("it != memories.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/shell-interface.h"
                  ,0xce,"virtual uint8_t wasm::ShellExternalInterface::load8u(Address, Name)");
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>::
           operator->(&local_30);
  address = Address::operator_cast_to_unsigned_long
                      ((Address *)&memoryName_local.super_IString.str._M_str);
  uVar2 = Memory::get<unsigned_char>(&ppVar3->second,address);
  return uVar2;
}

Assistant:

uint8_t load8u(Address addr, Name memoryName) override {
    auto it = memories.find(memoryName);
    assert(it != memories.end());
    auto& memory = it->second;
    return memory.get<uint8_t>(addr);
  }